

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.cpp
# Opt level: O0

void polyscope::showDelayedWarnings(void)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  type func;
  WarningMessage *currMessage;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  _Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
  *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_int
  *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 in_stack_ffffffffffffffdf;
  function<void_()> *in_stack_ffffffffffffffe0;
  
  if (((anonymous_namespace)::showingWarning & 1) == 0) {
    while (sVar2 = std::
                   deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
                   ::size((deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
                           *)0x360113), sVar2 != 0) {
      (anonymous_namespace)::showingWarning = 1;
      pvVar3 = std::
               deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
               ::front((deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
                        *)in_stack_ffffffffffffff80);
      if (0 < options::verbosity) {
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)options::printPrefix_abi_cxx11_);
        poVar4 = std::operator<<(poVar4,"[WARNING] ");
        std::operator<<(poVar4,(string *)pvVar3);
        bVar1 = std::operator!=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        if (bVar1) {
          poVar4 = std::operator<<((ostream *)&std::cout," --- ");
          std::operator<<(poVar4,(string *)&pvVar3->detailMessage);
        }
        if (0 < pvVar3->repeatCount) {
          poVar4 = std::operator<<((ostream *)&std::cout," (and ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,pvVar3->repeatCount);
          std::operator<<(poVar4," similar messages).");
        }
        std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      }
      in_stack_ffffffffffffff70 = &local_58;
      std::
      bind<void(&)(std::__cxx11::string,std::__cxx11::string,int),std::__cxx11::string&,std::__cxx11::string&,int&>
                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff78,(int *)in_stack_ffffffffffffff70);
      std::function<void()>::
      function<std::_Bind<void(*(std::__cxx11::string,std::__cxx11::string,int))(std::__cxx11::string,std::__cxx11::string,int)>&,void>
                ((function<void_()> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      pushContext(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
      std::function<void_()>::~function((function<void_()> *)0x36026a);
      std::
      deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
      ::pop_front((deque<polyscope::(anonymous_namespace)::WarningMessage,_std::allocator<polyscope::(anonymous_namespace)::WarningMessage>_>
                   *)in_stack_ffffffffffffff70);
      (anonymous_namespace)::showingWarning = 0;
      std::
      _Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
      ::~_Bind((_Bind<void_(*(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int))(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
                *)0x360287);
    }
  }
  return;
}

Assistant:

void showDelayedWarnings() {

  if (showingWarning) {
    return;
  }

  while (warningMessages.size() > 0) {
    showingWarning = true;
    WarningMessage& currMessage = warningMessages.front();

    if (options::verbosity > 0) {
      std::cout << options::printPrefix << "[WARNING] " << currMessage.baseMessage;
      if (currMessage.detailMessage != "") std::cout << " --- " << currMessage.detailMessage;
      if (currMessage.repeatCount > 0) std::cout << " (and " << currMessage.repeatCount << " similar messages).";
      std::cout << std ::endl;
    }

    auto func = std::bind(buildWarningUI, currMessage.baseMessage, currMessage.detailMessage, currMessage.repeatCount);
    pushContext(func, false);

    warningMessages.pop_front();
    showingWarning = false;
  }
}